

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void sgrproj_filter_stripe
               (RestorationUnitInfo *rui,int stripe_width,int stripe_height,int procunit_width,
               uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int32_t *tmpbuf,int bit_depth
               ,aom_internal_error_info *error_info)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  long in_stack_00000008;
  int in_stack_00000010;
  int32_t *in_stack_00000018;
  int in_stack_00000020;
  aom_internal_error_info *in_stack_00000028;
  int w;
  int j;
  int local_48;
  int local_40;
  
  for (local_40 = 0; local_40 < in_ESI; local_40 = in_ECX + local_40) {
    local_48 = in_ECX;
    if (in_ESI - local_40 <= in_ECX) {
      local_48 = in_ESI - local_40;
    }
    iVar1 = (*av1_apply_selfguided_restoration)
                      ((uint8_t *)(in_R8 + local_40),local_48,in_EDX,in_R9D,*(int *)(in_RDI + 0x30),
                       (int *)(in_RDI + 0x34),(uint8_t *)(in_stack_00000008 + local_40),
                       in_stack_00000010,in_stack_00000018,in_stack_00000020,0);
    if (iVar1 != 0) {
      aom_internal_error(in_stack_00000028,AOM_CODEC_MEM_ERROR,
                         "Error allocating buffer in av1_apply_selfguided_restoration");
    }
  }
  return;
}

Assistant:

static void sgrproj_filter_stripe(const RestorationUnitInfo *rui,
                                  int stripe_width, int stripe_height,
                                  int procunit_width, const uint8_t *src,
                                  int src_stride, uint8_t *dst, int dst_stride,
                                  int32_t *tmpbuf, int bit_depth,
                                  struct aom_internal_error_info *error_info) {
  (void)bit_depth;
  assert(bit_depth == 8);

  for (int j = 0; j < stripe_width; j += procunit_width) {
    int w = AOMMIN(procunit_width, stripe_width - j);
    if (av1_apply_selfguided_restoration(
            src + j, w, stripe_height, src_stride, rui->sgrproj_info.ep,
            rui->sgrproj_info.xqd, dst + j, dst_stride, tmpbuf, bit_depth,
            0) != 0) {
      aom_internal_error(
          error_info, AOM_CODEC_MEM_ERROR,
          "Error allocating buffer in av1_apply_selfguided_restoration");
    }
  }
}